

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

ostream * ast::operator<<(ostream *out,Expr *obj)

{
  string local_30 [32];
  
  (*(obj->super_Node)._vptr_Node[3])(local_30);
  std::operator<<(out,local_30);
  std::__cxx11::string::~string(local_30);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream &out, Expr const *obj)
    {
        out << obj->toString();
        return out;
    }